

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

ProStringList * prepareBuiltinArgs(ProStringList *__return_storage_ptr__,QList<ProStringList> *args)

{
  long lVar1;
  ProStringList *arg;
  ProStringList *this;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_80;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super_QList<ProString>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.ptr = (ProString *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.size = 0;
  QList<ProString>::reserve(&__return_storage_ptr__->super_QList<ProString>,(args->d).size);
  this = (args->d).ptr;
  for (lVar1 = (args->d).size * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    ProStringList::join((QString *)&local_80,this,(QChar)0x20);
    ProString::ProString(&local_68,(QString *)&local_80);
    QList<ProString>::emplaceBack<ProString_const&>
              (&__return_storage_ptr__->super_QList<ProString>,&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    this = this + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static ProStringList prepareBuiltinArgs(const QList<ProStringList> &args)
{
    ProStringList ret;
    ret.reserve(args.size());
    for (const ProStringList &arg : args)
        ret << arg.join(' ');
    return ret;
}